

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O0

Binds * __thiscall
jsonnet::internal::Desugarer::singleBind(Desugarer *this,Identifier *id,AST *body)

{
  initializer_list<jsonnet::internal::Local::Bind> __l;
  socklen_t in_ECX;
  sockaddr *in_RDX;
  int in_ESI;
  Binds *in_RDI;
  Bind *in_stack_fffffffffffffeb0;
  allocator_type *in_stack_fffffffffffffed8;
  Allocator *pAVar1;
  vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>
  *in_stack_fffffffffffffee0;
  Allocator *pAVar2;
  iterator in_stack_fffffffffffffee8;
  undefined1 *puVar3;
  undefined1 local_f5 [13];
  Allocator *local_e8;
  Allocator local_e0 [2];
  Allocator *local_30;
  _Rb_tree_node_base local_28;
  
  local_e8 = local_e0;
  bind((Desugarer *)local_e8,in_ESI,in_RDX,in_ECX);
  local_30 = local_e0;
  local_28._M_color = _S_black;
  local_28._4_4_ = 0;
  puVar3 = local_f5;
  ::std::allocator<jsonnet::internal::Local::Bind>::allocator
            ((allocator<jsonnet::internal::Local::Bind> *)0x21a865);
  __l._M_len = (size_type)puVar3;
  __l._M_array = in_stack_fffffffffffffee8;
  ::std::vector<jsonnet::internal::Local::Bind,_std::allocator<jsonnet::internal::Local::Bind>_>::
  vector(in_stack_fffffffffffffee0,__l,in_stack_fffffffffffffed8);
  ::std::allocator<jsonnet::internal::Local::Bind>::~allocator
            ((allocator<jsonnet::internal::Local::Bind> *)0x21a890);
  pAVar2 = local_e0;
  pAVar1 = (Allocator *)&local_30;
  do {
    pAVar1 = (Allocator *)
             &pAVar1[-3].internedIdentifiers._M_t._M_impl.super__Rb_tree_header._M_node_count;
    Local::Bind::~Bind(in_stack_fffffffffffffeb0);
  } while (pAVar1 != pAVar2);
  return in_RDI;
}

Assistant:

Local::Binds singleBind(const Identifier *id, AST *body)
    {
        return {bind(id, body)};
    }